

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O1

Result wabt::GenerateNames(Module *module)

{
  Import *pIVar1;
  Export *__rhs;
  pointer pTVar2;
  pointer pTVar3;
  Index IVar4;
  Result RVar5;
  long *plVar6;
  Func *pFVar7;
  pointer ppGVar8;
  pointer ppFVar9;
  pointer ppFVar10;
  pointer ppTVar11;
  pointer ppMVar12;
  pointer ppEVar13;
  pointer ppDVar14;
  pointer ppEVar15;
  long *plVar16;
  size_type *psVar17;
  pointer ppIVar18;
  Import *pIVar19;
  pointer ppIVar20;
  ulong uVar21;
  char *prefix;
  long lVar22;
  BindingHash *pBVar23;
  FuncImport *func_import;
  pointer ppEVar24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  Import *local_110;
  pointer local_108;
  Delegate local_100;
  NameGenerator generator;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  index_to_name;
  undefined1 local_60 [8];
  string new_name;
  
  local_100._vptr_Delegate = (_func_int **)&PTR__NameGenerator_0155ca88;
  generator.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)(_func_int **)0x0;
  ExprVisitor::ExprVisitor((ExprVisitor *)&generator.module_,&local_100);
  generator.num_table_imports_ = 0;
  generator.num_memory_imports_ = 0;
  generator.visitor_.expr_iter_stack_.
  super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  generator.label_count_ = 0;
  generator.num_func_imports_ = 0;
  ppIVar20 = (module->imports).super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppIVar18 = (module->imports).super__Vector_base<wabt::Import_*,_std::allocator<wabt::Import_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  generator.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)(Delegate)module;
  if (ppIVar20 != ppIVar18) {
    local_108 = ppIVar18;
    do {
      pIVar1 = *ppIVar20;
      uVar21 = 0xffffffff;
      switch(pIVar1->kind_) {
      case First:
        if (pIVar1 == (Import *)0x0) break;
        pBVar23 = (BindingHash *)
                  ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x1b0);
        pIVar19 = pIVar1 + 1;
        uVar21 = (ulong)generator.visitor_.expr_iter_stack_.
                        super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        generator.visitor_.expr_iter_stack_.
        super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)CONCAT44(generator.visitor_.expr_iter_stack_.
                               super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1,
                               generator.visitor_.expr_iter_stack_.
                               super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
        goto LAB_00f5a519;
      case Table:
        if (pIVar1 != (Import *)0x0) {
          pBVar23 = (BindingHash *)
                    ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x290);
          pIVar19 = pIVar1 + 1;
          uVar21 = generator._96_8_ & 0xffffffff;
          generator.label_count_ = generator.label_count_ + 1;
          goto LAB_00f5a519;
        }
        break;
      case Memory:
        if (pIVar1 != (Import *)0x0) {
          pBVar23 = (BindingHash *)
                    ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x2c8);
          pIVar19 = pIVar1 + 1;
          uVar21 = (ulong)generator.num_func_imports_;
          generator.num_func_imports_ = generator.num_func_imports_ + 1;
          goto LAB_00f5a519;
        }
        break;
      case Global:
        if (pIVar1 != (Import *)0x0) {
          pBVar23 = (BindingHash *)
                    ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x1e8);
          pIVar19 = pIVar1 + 1;
          uVar21 = generator._104_8_ & 0xffffffff;
          generator.num_table_imports_ = generator.num_table_imports_ + 1;
          goto LAB_00f5a519;
        }
        break;
      case Except:
        if (pIVar1 != (Import *)0x0) {
          pBVar23 = (BindingHash *)
                    ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x178);
          pIVar19 = pIVar1 + 1;
          uVar21 = (ulong)generator.num_memory_imports_;
          generator.num_memory_imports_ = generator.num_memory_imports_ + 1;
          goto LAB_00f5a519;
        }
      }
      pIVar19 = (Import *)0x0;
      pBVar23 = (BindingHash *)0x0;
LAB_00f5a519:
      if ((pBVar23 != (BindingHash *)0x0) && (pIVar19 != (Import *)0x0)) {
        if ((int)uVar21 == -1) {
          __assert_fail("index != kInvalidIndex",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/generate-names.cc"
                        ,0x148,
                        "Result wabt::(anonymous namespace)::NameGenerator::VisitImport(Import *)");
        }
        local_110 = pIVar19;
        new_name.field_2._8_8_ = uVar21;
        std::operator+(&local_130,'$',&pIVar1->module_name);
        plVar6 = (long *)std::__cxx11::string::_M_replace_aux
                                   ((string *)&local_130,local_130._M_string_length,0,1,'.');
        generator._112_8_ =
             &index_to_name.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
        plVar16 = plVar6 + 2;
        if ((long *)*plVar6 == plVar16) {
          index_to_name.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar16;
          index_to_name.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)plVar6[3];
        }
        else {
          index_to_name.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar16;
          generator._112_8_ = (long *)*plVar6;
        }
        index_to_name.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar6[1];
        *plVar6 = (long)plVar16;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((string *)&generator.num_global_imports_,
                                    (pIVar1->field_name)._M_dataplus._M_p,
                                    (pIVar1->field_name)._M_string_length);
        psVar17 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar17) {
          new_name._M_string_length = *psVar17;
          new_name.field_2._M_allocated_capacity = plVar6[3];
          local_60 = (undefined1  [8])&new_name._M_string_length;
        }
        else {
          new_name._M_string_length = *psVar17;
          local_60 = (undefined1  [8])*plVar6;
        }
        new_name._M_dataplus._M_p = (pointer)plVar6[1];
        *plVar6 = (long)psVar17;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((pointer *)generator._112_8_ !=
            &index_to_name.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
          operator_delete((void *)generator._112_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        anon_unknown_16::NameGenerator::MaybeUseAndBindName
                  (pBVar23,(char *)local_60,(Index)new_name.field_2._8_8_,(string *)local_110);
        ppIVar18 = local_108;
        if (local_60 != (undefined1  [8])&new_name._M_string_length) {
          operator_delete((void *)local_60);
          ppIVar18 = local_108;
        }
      }
      ppIVar20 = ppIVar20 + 1;
    } while (ppIVar20 != ppIVar18);
  }
  ppEVar24 = (module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  new_name.field_2._8_8_ =
       (module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (ppEVar24 != (pointer)new_name.field_2._8_8_) {
    do {
      __rhs = *ppEVar24;
      IVar4 = 0xffffffff;
      switch(__rhs->kind) {
      case First:
        pFVar7 = Module::GetFunc((Module *)generator.super_DelegateNop.super_Delegate._vptr_Delegate
                                 ,&__rhs->var);
        if (pFVar7 == (Func *)0x0) break;
        IVar4 = Module::GetFuncIndex
                          ((Module *)generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                           &__rhs->var);
        lVar22 = 0x1b0;
LAB_00f5a7ec:
        pBVar23 = (BindingHash *)
                  ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + lVar22);
        goto LAB_00f5a7f6;
      case Table:
        pFVar7 = (Func *)Module::GetTable((Module *)
                                          generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                                          &__rhs->var);
        if (pFVar7 != (Func *)0x0) {
          IVar4 = Module::GetTableIndex
                            ((Module *)generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                             &__rhs->var);
          lVar22 = 0x290;
          goto LAB_00f5a7ec;
        }
        break;
      case Memory:
        pFVar7 = (Func *)Module::GetMemory((Module *)
                                           generator.super_DelegateNop.super_Delegate._vptr_Delegate
                                           ,&__rhs->var);
        if (pFVar7 != (Func *)0x0) {
          IVar4 = Module::GetMemoryIndex
                            ((Module *)generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                             &__rhs->var);
          lVar22 = 0x2c8;
          goto LAB_00f5a7ec;
        }
        break;
      case Global:
        pFVar7 = (Func *)Module::GetGlobal((Module *)
                                           generator.super_DelegateNop.super_Delegate._vptr_Delegate
                                           ,&__rhs->var);
        if (pFVar7 != (Func *)0x0) {
          IVar4 = Module::GetGlobalIndex
                            ((Module *)generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                             &__rhs->var);
          lVar22 = 0x1e8;
          goto LAB_00f5a7ec;
        }
        break;
      case Except:
        pFVar7 = (Func *)Module::GetExcept((Module *)
                                           generator.super_DelegateNop.super_Delegate._vptr_Delegate
                                           ,&__rhs->var);
        if (pFVar7 != (Func *)0x0) {
          IVar4 = Module::GetExceptIndex
                            ((Module *)generator.super_DelegateNop.super_Delegate._vptr_Delegate,
                             &__rhs->var);
          lVar22 = 0x178;
          goto LAB_00f5a7ec;
        }
      }
      pFVar7 = (Func *)0x0;
      pBVar23 = (BindingHash *)0x0;
LAB_00f5a7f6:
      if ((pFVar7 != (Func *)0x0) && (pBVar23 != (BindingHash *)0x0)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                       ,'$',&__rhs->name);
        anon_unknown_16::NameGenerator::MaybeUseAndBindName
                  (pBVar23,(char *)local_60,IVar4,&pFVar7->name);
        if (local_60 != (undefined1  [8])&new_name._M_string_length) {
          operator_delete((void *)local_60);
        }
      }
      ppEVar24 = ppEVar24 + 1;
    } while (ppEVar24 != (pointer)new_name.field_2._8_8_);
  }
  ppGVar8 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppGVar8) {
    uVar21 = 0;
    do {
      if ((ppGVar8[uVar21]->name)._M_string_length == 0) {
        anon_unknown_16::NameGenerator::GenerateAndBindName
                  ((BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x1e8),"$g",
                   (Index)uVar21,&ppGVar8[uVar21]->name);
      }
      uVar21 = (ulong)((Index)uVar21 + 1);
      ppGVar8 = (module->globals).
                super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar21 < (ulong)((long)(module->globals).
                                    super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar8 >> 3)
            );
  }
  ppFVar9 = (module->func_types).
            super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((module->func_types).super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppFVar9) {
    uVar21 = 0;
    do {
      if ((ppFVar9[uVar21]->name)._M_string_length == 0) {
        anon_unknown_16::NameGenerator::GenerateAndBindName
                  ((BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 600),"$t",
                   (Index)uVar21,&ppFVar9[uVar21]->name);
      }
      uVar21 = (ulong)((Index)uVar21 + 1);
      ppFVar9 = (module->func_types).
                super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar21 < (ulong)((long)(module->func_types).
                                    super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar9 >> 3)
            );
  }
  ppFVar10 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if ((module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar10) {
    uVar21 = 0;
    do {
      pFVar7 = ppFVar10[uVar21];
      if ((pFVar7->name)._M_string_length == 0) {
        anon_unknown_16::NameGenerator::GenerateAndBindName
                  ((BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x1b0),"$f",
                   (Index)uVar21,&pFVar7->name);
      }
      generator.num_global_imports_ = 0;
      generator.num_exception_imports_ = 0;
      index_to_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      index_to_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar2 = (pFVar7->decl).sig.param_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      pTVar3 = (pFVar7->decl).sig.param_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_finish;
      new_name.field_2._8_8_ = uVar21;
      IVar4 = LocalTypes::size(&pFVar7->local_types);
      MakeTypeBindingReverseMapping
                ((ulong)(IVar4 + (int)((ulong)((long)pTVar3 - (long)pTVar2) >> 2)),&pFVar7->bindings
                 ,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&generator.num_global_imports_);
      if (index_to_name.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)generator._112_8_) {
        lVar22 = 0;
        uVar21 = 0;
        do {
          if (*(long *)(generator._112_8_ + 8 + lVar22) == 0) {
            prefix = "$p";
            if (((ulong)((long)(pFVar7->decl).sig.param_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(pFVar7->decl).sig.param_types.
                              super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2 & 0xffffffff) <= uVar21) {
              prefix = "$l";
            }
            local_60 = (undefined1  [8])&new_name._M_string_length;
            new_name._M_dataplus._M_p = (pointer)0x0;
            new_name._M_string_length = new_name._M_string_length & 0xffffffffffffff00;
            anon_unknown_16::NameGenerator::GenerateAndBindName
                      (&pFVar7->bindings,prefix,(Index)uVar21,(string *)local_60);
            std::__cxx11::string::_M_assign
                      ((string *)(generator._112_8_ + lVar22),(string *)local_60);
            if (local_60 != (undefined1  [8])&new_name._M_string_length) {
              operator_delete((void *)local_60);
            }
          }
          uVar21 = uVar21 + 1;
          lVar22 = lVar22 + 0x20;
        } while (uVar21 < (ulong)((long)index_to_name.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start -
                                  generator._112_8_ >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&generator.num_global_imports_);
      generator.visitor_.expr_iter_stack_.
      super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)generator.visitor_.expr_iter_stack_.
                            super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000)
      ;
      RVar5 = ExprVisitor::VisitFunc((ExprVisitor *)&generator.module_,pFVar7);
      if (RVar5.enum_ == Error) break;
      uVar21 = (ulong)((int)new_name.field_2._8_8_ + 1);
      ppFVar10 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar21 < (ulong)((long)(module->funcs).
                                    super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppFVar10 >> 3)
            );
  }
  ppTVar11 = (module->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((module->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppTVar11) {
    uVar21 = 0;
    do {
      if ((ppTVar11[uVar21]->name)._M_string_length == 0) {
        anon_unknown_16::NameGenerator::GenerateAndBindName
                  ((BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x290),"$T",
                   (Index)uVar21,&ppTVar11[uVar21]->name);
      }
      uVar21 = (ulong)((Index)uVar21 + 1);
      ppTVar11 = (module->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar21 < (ulong)((long)(module->tables).
                                    super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar11 >> 3
                             ));
  }
  ppMVar12 = (module->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((module->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl
      .super__Vector_impl_data._M_finish != ppMVar12) {
    uVar21 = 0;
    do {
      if ((ppMVar12[uVar21]->name)._M_string_length == 0) {
        anon_unknown_16::NameGenerator::GenerateAndBindName
                  ((BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x2c8),"$M",
                   (Index)uVar21,&ppMVar12[uVar21]->name);
      }
      uVar21 = (ulong)((Index)uVar21 + 1);
      ppMVar12 = (module->memories).
                 super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar21 < (ulong)((long)(module->memories).
                                    super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar12 >> 3
                             ));
  }
  ppEVar13 = (module->excepts).
             super__Vector_base<wabt::Exception_*,_std::allocator<wabt::Exception_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((module->excepts).super__Vector_base<wabt::Exception_*,_std::allocator<wabt::Exception_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppEVar13) {
    uVar21 = 0;
    do {
      if ((ppEVar13[uVar21]->name)._M_string_length == 0) {
        anon_unknown_16::NameGenerator::GenerateAndBindName
                  ((BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x178),"$e",
                   (Index)uVar21,&ppEVar13[uVar21]->name);
      }
      uVar21 = (ulong)((Index)uVar21 + 1);
      ppEVar13 = (module->excepts).
                 super__Vector_base<wabt::Exception_*,_std::allocator<wabt::Exception_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar21 < (ulong)((long)(module->excepts).
                                    super__Vector_base<wabt::Exception_*,_std::allocator<wabt::Exception_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar13 >> 3
                             ));
  }
  ppDVar14 = (module->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((module->data_segments).
      super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppDVar14) {
    uVar21 = 0;
    do {
      if ((ppDVar14[uVar21]->name)._M_string_length == 0) {
        anon_unknown_16::NameGenerator::GenerateAndBindName
                  ((BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x300),"$d",
                   (Index)uVar21,&ppDVar14[uVar21]->name);
      }
      uVar21 = (ulong)((Index)uVar21 + 1);
      ppDVar14 = (module->data_segments).
                 super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar21 < (ulong)((long)(module->data_segments).
                                    super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar14 >> 3
                             ));
  }
  ppEVar15 = (module->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((module->elem_segments).
      super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar15) {
    uVar21 = 0;
    do {
      if ((ppEVar15[uVar21]->name)._M_string_length == 0) {
        anon_unknown_16::NameGenerator::GenerateAndBindName
                  ((BindingHash *)
                   ((long)generator.super_DelegateNop.super_Delegate._vptr_Delegate + 0x338),"$e",
                   (Index)uVar21,&ppEVar15[uVar21]->name);
      }
      uVar21 = (ulong)((Index)uVar21 + 1);
      ppEVar15 = (module->elem_segments).
                 super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    } while (uVar21 < (ulong)((long)(module->elem_segments).
                                    super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar15 >> 3
                             ));
  }
  generator.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)(_func_int **)0x0;
  local_100._vptr_Delegate = (_func_int **)&PTR__NameGenerator_0155ca88;
  if (generator.visitor_.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(generator.visitor_.expr_stack_.
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (generator.visitor_.state_stack_.
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(generator.visitor_.state_stack_.
                    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (generator.visitor_.delegate_ != (Delegate *)0x0) {
    operator_delete(generator.visitor_.delegate_);
  }
  return (Result)Ok;
}

Assistant:

Result GenerateNames(Module* module) {
  NameGenerator generator;
  return generator.VisitModule(module);
}